

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_strrev_ascii(char *s)

{
  char cVar1;
  int iVar2;
  int local_1c;
  char t;
  int i;
  int end;
  int len;
  char *s_local;
  
  iVar2 = nk_strlen(s);
  for (local_1c = 0; local_1c < iVar2 / 2; local_1c = local_1c + 1) {
    cVar1 = s[local_1c];
    s[local_1c] = s[(iVar2 + -1) - local_1c];
    s[(iVar2 + -1) - local_1c] = cVar1;
  }
  return;
}

Assistant:

NK_INTERN void
nk_strrev_ascii(char *s)
{
    int len = nk_strlen(s);
    int end = len / 2;
    int i = 0;
    char t;
    for (; i < end; ++i) {
        t = s[i];
        s[i] = s[len - 1 - i];
        s[len -1 - i] = t;
    }
}